

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

bool __thiscall cmCursesMainForm::LookForCacheEntry(cmCursesMainForm *this,string *key)

{
  __type _Var1;
  bool bVar2;
  pointer ppcVar3;
  bool bVar4;
  
  if (this->Entries ==
      (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *)0x0)
  {
    bVar2 = false;
  }
  else {
    ppcVar3 = (this->Entries->
              super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar4 = ppcVar3 ==
              (this->Entries->
              super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
      bVar2 = !bVar4;
      if (bVar4) {
        return bVar2;
      }
      _Var1 = std::operator==(key,&(*ppcVar3)->Key);
      ppcVar3 = ppcVar3 + 1;
    } while (!_Var1);
  }
  return bVar2;
}

Assistant:

bool cmCursesMainForm::LookForCacheEntry(const std::string& key)
{
  if (!this->Entries)
    {
    return false;
    }

  std::vector<cmCursesCacheEntryComposite*>::iterator it;
  for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
    {
    if (key == (*it)->Key)
      {
      return true;
      }
    }

  return false;
}